

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pHVar1;
  pointer psVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer psVar8;
  int i;
  int iVar9;
  char *in_R9;
  AssertionResult gtest_ar_;
  iterator it;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [40];
  iterator local_b0;
  nonempty_iterator local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  undefined8 *local_90;
  HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_88;
  undefined1 local_80 [80];
  
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  local_88 = this;
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)local_e8);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_80,&this_00->rep,(const_reference)local_e8);
  pHVar1 = &local_88->
            super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ;
  if ((char *)local_e8._8_8_ != "hi") {
    free((void *)local_e8._8_8_);
  }
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::begin((iterator *)local_80,&this_00->rep);
  iVar9 = 1;
  local_80._72_8_ =
       &(pHVar1->
        super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ).ht_;
  do {
    uVar7 = local_80._32_8_;
    uVar6 = local_80._24_8_;
    uVar5 = local_80._16_8_;
    uVar4 = local_80._8_8_;
    local_80._32_8_ = local_80._32_8_ + 0x10;
    psVar8 = (pointer)local_80._24_8_;
    if ((pointer)local_80._32_8_ ==
        *(pointer *)local_80._24_8_ + ((Settings *)(local_80._24_8_ + 8))->num_buckets) {
      do {
        psVar8 = (pointer)(local_80._24_8_ + 0x28);
        if (psVar8 == (pointer)local_80._16_8_) break;
        local_80._32_8_ = psVar8->group;
        psVar2 = (pointer)(local_80._24_8_ + 0x28);
        local_80._24_8_ = psVar8;
      } while ((psVar2->settings).num_buckets == 0);
    }
    local_80._24_8_ = psVar8;
    google::
    sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)local_80);
    local_e8._8_8_ =
         ((_Vector_impl_data *)
         ((long)&(local_88->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.table + 0x10))->_M_start;
    local_d8._0_8_ =
         *(pointer *)
          ((long)&(local_88->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.table + 0x18);
    local_d8._16_8_ = (pointer)0x0;
    local_a8 = (nonempty_iterator)0x0;
    local_e8._0_8_ = this_00;
    local_d8._8_8_ = local_d8._0_8_;
    local_d8._24_8_ = local_e8._8_8_;
    local_d8._32_8_ = local_d8._0_8_;
    local_b0._M_current =
         (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
          *)local_d8._0_8_;
    google::
    sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)local_e8);
    if (((uVar4 == local_e8._8_8_) && (uVar5 == local_d8._0_8_)) && (uVar6 == local_d8._8_8_)) {
      local_98[0] = (internal)(uVar7 != local_d8._16_8_ && uVar6 != uVar5);
      local_90 = (undefined8 *)0x0;
      if (uVar7 == local_d8._16_8_ || uVar6 == uVar5) {
        testing::Message::Message((Message *)&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e8,local_98,(AssertionResult *)"i && (it++ != this->ht_.end())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x142,(char *)local_e8._0_8_);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)local_e8._0_8_ !=
            (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)local_d8) {
          operator_delete((void *)local_e8._0_8_);
        }
        if (local_f0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_f0._M_head_impl + 8))();
        }
      }
    }
    else {
      local_98[0] = (internal)0x1;
      local_90 = (undefined8 *)0x0;
    }
    puVar3 = local_90;
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar3);
    }
    iVar9 = iVar9 + 1;
    if (iVar9 == 10) {
      local_e8._8_8_ =
           ((_Vector_impl_data *)
           ((long)&(local_88->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x10))->_M_start;
      local_d8._0_8_ =
           *(pointer *)
            ((long)&(local_88->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.table + 0x18);
      local_d8._16_8_ = (pointer)0x0;
      local_a8 = (nonempty_iterator)0x0;
      local_e8._0_8_ = this_00;
      local_d8._8_8_ = local_d8._0_8_;
      local_d8._24_8_ = local_e8._8_8_;
      local_d8._32_8_ = local_d8._0_8_;
      local_b0._M_current =
           (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
            *)local_d8._0_8_;
      google::
      sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_deleted
                ((sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_e8);
      local_98[0] = (internal)0x0;
      if (local_80._8_8_ == local_e8._8_8_) {
        if ((local_80._16_8_ == local_d8._0_8_) && (local_80._24_8_ == local_d8._8_8_)) {
          if (local_80._24_8_ == local_80._16_8_) {
            local_98[0] = (internal)0x1;
          }
          else {
            local_98[0] = (internal)(local_80._32_8_ == local_d8._16_8_);
          }
        }
        else {
          local_98[0] = (internal)0x0;
        }
      }
      local_90 = (undefined8 *)0x0;
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e8,local_98,(AssertionResult *)"it == this->ht_.end()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x144,(char *)local_e8._0_8_);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)local_e8._0_8_ !=
            (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)local_d8) {
          operator_delete((void *)local_e8._0_8_);
        }
        if (local_f0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_f0._M_head_impl + 8))();
        }
      }
      puVar3 = local_90;
      if (local_90 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_90 != local_90 + 2) {
          operator_delete((undefined8 *)*local_90);
        }
        operator_delete(puVar3);
      }
      return;
    }
  } while( true );
}

Assistant:

TYPED_TEST(HashtableAllTest, Iterating) {
  // Test a bit more iterating than just one ++.
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  typename TypeParam::iterator it = this->ht_.begin();
  for (int i = 1; i <= 9; i++) {  // start at 1 so i is never 0
    // && here makes it easier to tell what loop iteration the test failed on.
    EXPECT_TRUE(i && (it++ != this->ht_.end()));
  }
  EXPECT_TRUE(it == this->ht_.end());
}